

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [16];
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  ulong uVar14;
  float fVar15;
  __m128 _outp;
  __m128 _b;
  __m128 _p;
  int i;
  binary_op_pow op;
  v4sf pow2n;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0_1;
  v4sf fx;
  v4sf tmp_1;
  v4sf y;
  v4sf z;
  v4sf tmp;
  v4sf mask;
  v4sf e;
  v4sf invalid_mask;
  v4sf one;
  v4si emm0;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  int local_d3c;
  undefined1 local_d35;
  int local_d34;
  float *local_d30;
  float *local_d28;
  undefined1 (*local_d20) [16];
  float *local_d18;
  undefined1 (*local_d10) [16];
  undefined8 local_d08;
  undefined8 uStack_d00;
  float *local_cf0;
  undefined8 *local_ce8;
  undefined8 *local_ce0;
  undefined1 *local_cd8;
  float *local_cd0;
  undefined1 (*local_cc8) [16];
  undefined1 *local_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  float local_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  ulong local_ad8;
  ulong uStack_ad0;
  int local_ac8;
  int iStack_ac4;
  int iStack_ac0;
  int iStack_abc;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  int local_aa8;
  int iStack_aa4;
  int iStack_aa0;
  int iStack_a9c;
  undefined8 local_a98;
  undefined8 uStack_a90;
  int local_a88;
  int iStack_a84;
  int iStack_a80;
  int iStack_a7c;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  ulong local_9d8;
  ulong uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  ulong local_8c8;
  ulong uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  ulong local_8a8;
  ulong uStack_8a0;
  ulong local_898;
  ulong uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  ulong local_878;
  ulong uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  ulong local_858;
  ulong uStack_850;
  undefined8 *local_840;
  float *local_838;
  float *local_830;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  undefined8 local_818;
  undefined8 uStack_810;
  float local_808 [2];
  float afStack_800 [2];
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 *local_7e0;
  float *local_7d8;
  float *local_7d0;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  float local_7a8 [2];
  float afStack_7a0 [2];
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 *local_780;
  float *local_778;
  float *local_770;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  undefined8 local_758;
  undefined8 uStack_750;
  float local_748 [2];
  float afStack_740 [2];
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 *local_720;
  float *local_718;
  float *local_710;
  undefined8 local_708;
  undefined8 uStack_700;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float local_6e8 [2];
  float afStack_6e0 [2];
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 *local_6c0;
  float *local_6b8;
  float *local_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_688 [2];
  float afStack_680 [2];
  undefined8 local_678;
  undefined8 uStack_670;
  float *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  float local_648 [2];
  float afStack_640 [2];
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  float *local_600;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  float local_5e8 [2];
  float afStack_5e0 [2];
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  float *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  float local_588 [2];
  float afStack_580 [2];
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  float *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  float local_528 [2];
  float afStack_520 [2];
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  float *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  float local_4c8 [2];
  float afStack_4c0 [2];
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  float *local_480;
  undefined8 *local_478;
  undefined8 *local_470;
  float local_468 [2];
  float afStack_460 [2];
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  float *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  float local_408 [2];
  float afStack_400 [2];
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  float *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  float local_3a8 [2];
  float afStack_3a0 [2];
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  float *local_300;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  float local_2e8 [2];
  float afStack_2e0 [2];
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  float local_288 [2];
  float afStack_280 [2];
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  float *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  float local_228 [2];
  float afStack_220 [2];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  float *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  float local_1c8 [2];
  float afStack_1c0 [2];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  float *local_180;
  undefined8 *local_178;
  undefined8 *local_170;
  float local_168 [2];
  float afStack_160 [2];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  ulong uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_d30 = in_RDX;
  local_d28 = in_RSI;
  local_d20 = in_RDI;
  for (local_d3c = 0; local_d34 = in_ECX, local_d3c + 3 < in_ECX; local_d3c = local_d3c + 4) {
    local_d10 = local_d20;
    local_d58 = *(undefined8 *)*local_d20;
    uStack_d50 = *(undefined8 *)(*local_d20 + 8);
    local_d18 = local_d28;
    local_d68 = *(undefined8 *)local_d28;
    uStack_d60 = *(undefined8 *)(local_d28 + 2);
    local_cd8 = &local_d35;
    local_ce0 = &local_d58;
    local_ce8 = &local_d68;
    local_c48 = 0x3f8000003f800000;
    uStack_c40 = 0x3f8000003f800000;
    local_948 = 0;
    uStack_940 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8._0_4_ = (float)local_d58;
    local_c8._4_4_ = (float)((ulong)local_d58 >> 0x20);
    uStack_c0._0_4_ = (float)uStack_d50;
    uStack_c0._4_4_ = (float)((ulong)uStack_d50 >> 0x20);
    local_aa8 = -(uint)((float)local_c8 <= 0.0);
    iStack_aa4 = -(uint)(local_c8._4_4_ <= 0.0);
    iStack_aa0 = -(uint)((float)uStack_c0 <= 0.0);
    iStack_a9c = -(uint)(uStack_c0._4_4_ <= 0.0);
    local_968 = 0x80000000800000;
    uStack_960 = 0x80000000800000;
    auVar6._8_8_ = 0x80000000800000;
    auVar6._0_8_ = 0x80000000800000;
    auVar8 = maxps(*local_d20,auVar6);
    local_a78 = auVar8._0_8_;
    local_98 = local_a78;
    uStack_a70 = auVar8._8_8_;
    uStack_90 = uStack_a70;
    uVar1 = local_a78;
    uVar2 = uStack_a70;
    local_ac = 0x17;
    local_a8._0_4_ = auVar8._0_4_;
    local_a8._4_4_ = auVar8._4_4_;
    uStack_a0._0_4_ = auVar8._8_4_;
    uStack_a0._4_4_ = auVar8._12_4_;
    local_878 = local_a78;
    uStack_870 = uStack_a70;
    local_888 = 0x807fffff807fffff;
    uStack_880 = 0x807fffff807fffff;
    local_58 = local_a78 & 0x807fffff807fffff;
    uStack_50 = uStack_a70 & 0x807fffff807fffff;
    local_bd8 = 0x3f0000003f000000;
    uStack_bd0 = 0x3f0000003f000000;
    local_9d8 = local_58 | 0x3f0000003f000000;
    uStack_9d0 = uStack_50 | 0x3f0000003f000000;
    local_38 = CONCAT44(local_a8._4_4_ >> 0x17,(uint)local_a8 >> 0x17);
    uStack_30 = CONCAT44(uStack_a0._4_4_ >> 0x17,(uint)uStack_a0 >> 0x17);
    local_128 = 0x7f0000007f;
    uStack_120 = 0x7f0000007f;
    local_a88 = ((uint)local_a8 >> 0x17) - 0x7f;
    iStack_a84 = (local_a8._4_4_ >> 0x17) - 0x7f;
    iStack_a80 = ((uint)uStack_a0 >> 0x17) - 0x7f;
    iStack_a7c = (uStack_a0._4_4_ >> 0x17) - 0x7f;
    local_908 = CONCAT44(iStack_a84,local_a88);
    uStack_900 = CONCAT44(iStack_a7c,iStack_a80);
    local_a18 = CONCAT44((float)iStack_a84,(float)local_a88);
    uStack_a10 = CONCAT44((float)iStack_a7c,(float)iStack_a80);
    local_a28 = 0x3f8000003f800000;
    uStack_a20 = 0x3f8000003f800000;
    local_ab8 = (float)local_a88 + 1.0;
    fStack_ab4 = (float)iStack_a84 + 1.0;
    fStack_ab0 = (float)iStack_a80 + 1.0;
    fStack_aac = (float)iStack_a7c + 1.0;
    local_28 = 0x3f3504f33f3504f3;
    uStack_20 = 0x3f3504f33f3504f3;
    local_18._0_4_ = (float)local_9d8;
    local_18._4_4_ = (float)(local_9d8 >> 0x20);
    uStack_10._0_4_ = (float)uStack_9d0;
    uStack_10._4_4_ = (float)(uStack_9d0 >> 0x20);
    local_ac8 = -(uint)((float)local_18 < 0.70710677);
    iStack_ac4 = -(uint)(local_18._4_4_ < 0.70710677);
    iStack_ac0 = -(uint)((float)uStack_10 < 0.70710677);
    iStack_abc = -(uint)(uStack_10._4_4_ < 0.70710677);
    local_8a8 = CONCAT44(iStack_ac4,local_ac8);
    uStack_8a0 = CONCAT44(iStack_abc,iStack_ac0);
    local_ad8 = local_9d8 & local_8a8;
    uStack_ad0 = uStack_9d0 & uStack_8a0;
    local_9e8 = 0x3f8000003f800000;
    uStack_9e0 = 0x3f8000003f800000;
    local_a78 = CONCAT44(local_18._4_4_ - 1.0,(float)local_18 - 1.0);
    uStack_a70._0_4_ = (float)uStack_10 - 1.0;
    uStack_a70._4_4_ = uStack_10._4_4_ - 1.0;
    local_9f8 = CONCAT44(fStack_ab4,local_ab8);
    uStack_9f0 = CONCAT44(fStack_aac,fStack_ab0);
    local_8b8 = 0x3f8000003f800000;
    uStack_8b0 = 0x3f8000003f800000;
    local_8c8 = CONCAT44(iStack_ac4,local_ac8);
    uStack_8c0 = CONCAT44(iStack_abc,iStack_ac0);
    uVar11 = local_8c8 & 0x3f8000003f800000;
    uVar14 = uStack_8c0 & 0x3f8000003f800000;
    local_a08._0_4_ = (float)uVar11;
    local_a08._4_4_ = (float)(uVar11 >> 0x20);
    uStack_a00._0_4_ = (float)uVar14;
    uStack_a00._4_4_ = (float)(uVar14 >> 0x20);
    local_ab8 = local_ab8 - (float)local_a08;
    fStack_ab4 = fStack_ab4 - local_a08._4_4_;
    fStack_ab0 = fStack_ab0 - (float)uStack_a00;
    fStack_aac = fStack_aac - uStack_a00._4_4_;
    local_a38 = local_a78;
    uStack_a30 = uStack_a70;
    local_a48._0_4_ = (float)local_ad8;
    local_a48._4_4_ = (float)(local_ad8 >> 0x20);
    uStack_a40._0_4_ = (float)uStack_ad0;
    uStack_a40._4_4_ = (float)(uStack_ad0 >> 0x20);
    local_a48._0_4_ = ((float)local_18 - 1.0) + (float)local_a48;
    local_a48._4_4_ = (local_18._4_4_ - 1.0) + local_a48._4_4_;
    uStack_a40._0_4_ = ((float)uStack_10 - 1.0) + (float)uStack_a40;
    uStack_a40._4_4_ = (uStack_10._4_4_ - 1.0) + uStack_a40._4_4_;
    local_a78 = CONCAT44(local_a48._4_4_,(float)local_a48);
    uStack_a70._0_4_ = (float)uStack_a40;
    uStack_a70._4_4_ = uStack_a40._4_4_;
    local_988 = local_a78;
    uStack_980 = uStack_a70;
    local_ae8 = (float)local_a48 * (float)local_a48;
    fStack_ae4 = local_a48._4_4_ * local_a48._4_4_;
    fStack_ae0 = (float)uStack_a40 * (float)uStack_a40;
    fStack_adc = uStack_a40._4_4_ * uStack_a40._4_4_;
    local_840 = &local_af8;
    local_720 = &local_a78;
    local_3c0 = ::_ps_cephes_log_p1;
    local_378 = 0x3d9021bb3d9021bb;
    uStack_370 = 0x3d9021bb3d9021bb;
    local_388 = local_a78;
    uStack_380 = uStack_a70;
    local_398 = (float)local_a48 * 0.070376836;
    fStack_394 = local_a48._4_4_ * 0.070376836;
    fStack_390 = (float)uStack_a40 * 0.070376836;
    fStack_38c = uStack_a40._4_4_ * 0.070376836;
    local_3a8[0] = -0.1151461;
    local_3a8[1] = -0.1151461;
    afStack_3a0[0] = -0.1151461;
    afStack_3a0[1] = -0.1151461;
    local_af8 = CONCAT44(fStack_394 + -0.1151461,local_398 + -0.1151461);
    uStack_af0 = CONCAT44(fStack_38c + -0.1151461,fStack_390 + -0.1151461);
    local_420 = ::_ps_cephes_log_p2;
    local_3d8 = local_af8;
    uStack_3d0 = uStack_af0;
    local_3e8 = local_a78;
    uStack_3e0 = uStack_a70;
    local_3f8 = (local_398 + -0.1151461) * (float)local_a48;
    fStack_3f4 = (fStack_394 + -0.1151461) * local_a48._4_4_;
    fStack_3f0 = (fStack_390 + -0.1151461) * (float)uStack_a40;
    fStack_3ec = (fStack_38c + -0.1151461) * uStack_a40._4_4_;
    local_408[0] = 0.116769984;
    local_408[1] = 0.116769984;
    afStack_400[0] = 0.116769984;
    afStack_400[1] = 0.116769984;
    local_af8 = CONCAT44(fStack_3f4 + 0.116769984,local_3f8 + 0.116769984);
    uStack_af0 = CONCAT44(fStack_3ec + 0.116769984,fStack_3f0 + 0.116769984);
    local_480 = ::_ps_cephes_log_p3;
    local_438 = local_af8;
    uStack_430 = uStack_af0;
    local_448 = local_a78;
    uStack_440 = uStack_a70;
    local_458 = (local_3f8 + 0.116769984) * (float)local_a48;
    fStack_454 = (fStack_3f4 + 0.116769984) * local_a48._4_4_;
    fStack_450 = (fStack_3f0 + 0.116769984) * (float)uStack_a40;
    fStack_44c = (fStack_3ec + 0.116769984) * uStack_a40._4_4_;
    local_468[0] = -0.12420141;
    local_468[1] = -0.12420141;
    afStack_460[0] = -0.12420141;
    afStack_460[1] = -0.12420141;
    local_af8 = CONCAT44(fStack_454 + -0.12420141,local_458 + -0.12420141);
    uStack_af0 = CONCAT44(fStack_44c + -0.12420141,fStack_450 + -0.12420141);
    local_4e0 = ::_ps_cephes_log_p4;
    local_498 = local_af8;
    uStack_490 = uStack_af0;
    local_4a8 = local_a78;
    uStack_4a0 = uStack_a70;
    local_4b8 = (local_458 + -0.12420141) * (float)local_a48;
    fStack_4b4 = (fStack_454 + -0.12420141) * local_a48._4_4_;
    fStack_4b0 = (fStack_450 + -0.12420141) * (float)uStack_a40;
    fStack_4ac = (fStack_44c + -0.12420141) * uStack_a40._4_4_;
    local_4c8[0] = 0.14249323;
    local_4c8[1] = 0.14249323;
    afStack_4c0[0] = 0.14249323;
    afStack_4c0[1] = 0.14249323;
    local_af8 = CONCAT44(fStack_4b4 + 0.14249323,local_4b8 + 0.14249323);
    uStack_af0 = CONCAT44(fStack_4ac + 0.14249323,fStack_4b0 + 0.14249323);
    local_540 = ::_ps_cephes_log_p5;
    local_4f8 = local_af8;
    uStack_4f0 = uStack_af0;
    local_508 = local_a78;
    uStack_500 = uStack_a70;
    local_518 = (local_4b8 + 0.14249323) * (float)local_a48;
    fStack_514 = (fStack_4b4 + 0.14249323) * local_a48._4_4_;
    fStack_510 = (fStack_4b0 + 0.14249323) * (float)uStack_a40;
    fStack_50c = (fStack_4ac + 0.14249323) * uStack_a40._4_4_;
    local_528[0] = -0.16668057;
    local_528[1] = -0.16668057;
    afStack_520[0] = -0.16668057;
    afStack_520[1] = -0.16668057;
    local_af8 = CONCAT44(fStack_514 + -0.16668057,local_518 + -0.16668057);
    uStack_af0 = CONCAT44(fStack_50c + -0.16668057,fStack_510 + -0.16668057);
    local_5a0 = ::_ps_cephes_log_p6;
    local_558 = local_af8;
    uStack_550 = uStack_af0;
    local_568 = local_a78;
    uStack_560 = uStack_a70;
    local_578 = (local_518 + -0.16668057) * (float)local_a48;
    fStack_574 = (fStack_514 + -0.16668057) * local_a48._4_4_;
    fStack_570 = (fStack_510 + -0.16668057) * (float)uStack_a40;
    fStack_56c = (fStack_50c + -0.16668057) * uStack_a40._4_4_;
    local_588[0] = 0.20000714;
    local_588[1] = 0.20000714;
    afStack_580[0] = 0.20000714;
    afStack_580[1] = 0.20000714;
    local_af8 = CONCAT44(fStack_574 + 0.20000714,local_578 + 0.20000714);
    uStack_af0 = CONCAT44(fStack_56c + 0.20000714,fStack_570 + 0.20000714);
    local_600 = ::_ps_cephes_log_p7;
    local_5b8 = local_af8;
    uStack_5b0 = uStack_af0;
    local_5c8 = local_a78;
    uStack_5c0 = uStack_a70;
    local_5d8 = (local_578 + 0.20000714) * (float)local_a48;
    fStack_5d4 = (fStack_574 + 0.20000714) * local_a48._4_4_;
    fStack_5d0 = (fStack_570 + 0.20000714) * (float)uStack_a40;
    fStack_5cc = (fStack_56c + 0.20000714) * uStack_a40._4_4_;
    local_5e8[0] = -0.24999994;
    local_5e8[1] = -0.24999994;
    afStack_5e0[0] = -0.24999994;
    afStack_5e0[1] = -0.24999994;
    local_af8 = CONCAT44(fStack_5d4 + -0.24999994,local_5d8 + -0.24999994);
    uStack_af0 = CONCAT44(fStack_5cc + -0.24999994,fStack_5d0 + -0.24999994);
    local_660 = ::_ps_cephes_log_p8;
    local_618 = local_af8;
    uStack_610 = uStack_af0;
    local_628 = local_a78;
    uStack_620 = uStack_a70;
    local_638 = (local_5d8 + -0.24999994) * (float)local_a48;
    fStack_634 = (fStack_5d4 + -0.24999994) * local_a48._4_4_;
    fStack_630 = (fStack_5d0 + -0.24999994) * (float)uStack_a40;
    fStack_62c = (fStack_5cc + -0.24999994) * uStack_a40._4_4_;
    local_648[0] = 0.3333333;
    local_648[1] = 0.3333333;
    afStack_640[0] = 0.3333333;
    afStack_640[1] = 0.3333333;
    local_af8 = CONCAT44(fStack_634 + 0.3333333,local_638 + 0.3333333);
    uStack_af0 = CONCAT44(fStack_62c + 0.3333333,fStack_630 + 0.3333333);
    local_998 = local_af8;
    uStack_990 = uStack_af0;
    local_9a8 = local_a78;
    uStack_9a0 = uStack_a70;
    fVar10 = (local_638 + 0.3333333) * (float)local_a48;
    fVar12 = (fStack_634 + 0.3333333) * local_a48._4_4_;
    fVar13 = (fStack_630 + 0.3333333) * (float)uStack_a40;
    fVar15 = (fStack_62c + 0.3333333) * uStack_a40._4_4_;
    local_af8 = CONCAT44(fVar12,fVar10);
    uStack_af0 = CONCAT44(fVar15,fVar13);
    local_9b8 = local_af8;
    uStack_9b0 = uStack_af0;
    local_9c8 = CONCAT44(fStack_ae4,local_ae8);
    uStack_9c0 = CONCAT44(fStack_adc,fStack_ae0);
    fVar10 = fVar10 * local_ae8;
    fVar12 = fVar12 * fStack_ae4;
    fVar13 = fVar13 * fStack_ae0;
    fVar15 = fVar15 * fStack_adc;
    local_af8 = CONCAT44(fVar12,fVar10);
    uStack_af0 = CONCAT44(fVar15,fVar13);
    local_710 = &local_ab8;
    local_6b8 = ::_ps_cephes_log_q1;
    local_678 = CONCAT44(fStack_ab4,local_ab8);
    uStack_670 = CONCAT44(fStack_aac,fStack_ab0);
    local_688[0] = -0.00021219444;
    local_688[1] = -0.00021219444;
    afStack_680[0] = -0.00021219444;
    afStack_680[1] = -0.00021219444;
    local_698 = local_ab8 * -0.00021219444;
    fStack_694 = fStack_ab4 * -0.00021219444;
    fStack_690 = fStack_ab0 * -0.00021219444;
    fStack_68c = fStack_aac * -0.00021219444;
    local_6a8 = local_af8;
    uStack_6a0 = uStack_af0;
    fVar10 = local_698 + fVar10;
    fVar12 = fStack_694 + fVar12;
    fVar13 = fStack_690 + fVar13;
    fVar15 = fStack_68c + fVar15;
    local_af8 = CONCAT44(fVar12,fVar10);
    uStack_af0 = CONCAT44(fVar15,fVar13);
    local_830 = &local_ae8;
    local_838 = ::_ps_0p5;
    local_818 = local_af8;
    uStack_810 = uStack_af0;
    local_7f8 = CONCAT44(fStack_ae4,local_ae8);
    uStack_7f0 = CONCAT44(fStack_adc,fStack_ae0);
    local_808[0] = 0.5;
    local_808[1] = 0.5;
    afStack_800[0] = 0.5;
    afStack_800[1] = 0.5;
    local_828 = local_ae8 * 0.5;
    fStack_824 = fStack_ae4 * 0.5;
    fStack_820 = fStack_ae0 * 0.5;
    fStack_81c = fStack_adc * 0.5;
    fVar10 = fVar10 - local_828;
    fVar12 = fVar12 - fStack_824;
    fVar13 = fVar13 - fStack_820;
    fVar15 = fVar15 - fStack_81c;
    local_af8 = CONCAT44(fVar12,fVar10);
    uStack_af0 = CONCAT44(fVar15,fVar13);
    local_a58 = local_a78;
    uStack_a50 = uStack_a70;
    local_a68 = local_af8;
    uStack_a60 = uStack_af0;
    local_a48._0_4_ = (float)local_a48 + fVar10;
    local_a48._4_4_ = local_a48._4_4_ + fVar12;
    uStack_a40._0_4_ = (float)uStack_a40 + fVar13;
    uStack_a40._4_4_ = uStack_a40._4_4_ + fVar15;
    local_a78 = CONCAT44(local_a48._4_4_,(float)local_a48);
    uStack_a70._0_4_ = (float)uStack_a40;
    uStack_a70._4_4_ = uStack_a40._4_4_;
    local_718 = ::_ps_cephes_log_q2;
    local_6d8 = CONCAT44(fStack_ab4,local_ab8);
    uStack_6d0 = CONCAT44(fStack_aac,fStack_ab0);
    local_6e8[0] = 0.6933594;
    local_6e8[1] = 0.6933594;
    afStack_6e0[0] = 0.6933594;
    afStack_6e0[1] = 0.6933594;
    local_6f8 = local_ab8 * 0.6933594;
    fStack_6f4 = fStack_ab4 * 0.6933594;
    fStack_6f0 = fStack_ab0 * 0.6933594;
    fStack_6ec = fStack_aac * 0.6933594;
    local_708 = local_a78;
    uStack_700 = uStack_a70;
    local_a78 = CONCAT44(fStack_6f4 + local_a48._4_4_,local_6f8 + (float)local_a48);
    uStack_a70._0_4_ = fStack_6f0 + (float)uStack_a40;
    uStack_a70._4_4_ = fStack_6ec + uStack_a40._4_4_;
    local_78 = local_a78;
    uStack_70 = uStack_a70;
    local_88 = CONCAT44(iStack_aa4,local_aa8);
    uStack_80 = CONCAT44(iStack_a9c,iStack_aa0);
    local_a78 = local_a78 | local_88;
    uStack_a70 = uStack_a70 | uStack_80;
    local_c88._0_4_ = (float)local_d68;
    local_c88._4_4_ = (float)((ulong)local_d68 >> 0x20);
    uStack_c80._0_4_ = (float)uStack_d60;
    uStack_c80._4_4_ = (float)((ulong)uStack_d60 >> 0x20);
    local_c98._0_4_ = (float)local_a78;
    local_c98._4_4_ = (float)(local_a78 >> 0x20);
    uStack_c90._0_4_ = (float)uStack_a70;
    uStack_c90._4_4_ = (float)(uStack_a70 >> 0x20);
    local_c08 = CONCAT44(local_c88._4_4_ * local_c98._4_4_,(float)local_c88 * (float)local_c98);
    uStack_c00._0_4_ = (float)uStack_c80 * (float)uStack_c90;
    uStack_c00._4_4_ = uStack_c80._4_4_ * uStack_c90._4_4_;
    local_938 = 0;
    uStack_930 = 0;
    local_b08 = local_c08;
    uStack_b00 = uStack_c00;
    local_b18 = 0x42b0c0a542b0c0a5;
    uStack_b10 = 0x42b0c0a542b0c0a5;
    auVar5._8_8_ = uStack_c00;
    auVar5._0_8_ = local_c08;
    auVar9._8_8_ = 0x42b0c0a542b0c0a5;
    auVar9._0_8_ = 0x42b0c0a542b0c0a5;
    auVar9 = minps(auVar5,auVar9);
    local_c08 = auVar9._0_8_;
    local_b28 = local_c08;
    uStack_c00 = auVar9._8_8_;
    uStack_b20 = uStack_c00;
    local_b38 = 0xc2b0c0a5c2b0c0a5;
    uStack_b30 = 0xc2b0c0a5c2b0c0a5;
    auVar8._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar8._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar8 = maxps(auVar9,auVar8);
    local_c08 = auVar8._0_8_;
    uVar3 = local_c08;
    uStack_c00 = auVar8._8_8_;
    uVar4 = uStack_c00;
    local_b58 = 0x3fb8aa3b3fb8aa3b;
    uStack_b50 = 0x3fb8aa3b3fb8aa3b;
    local_b48._0_4_ = auVar8._0_4_;
    local_b48._4_4_ = auVar8._4_4_;
    uStack_b40._0_4_ = auVar8._8_4_;
    uStack_b40._4_4_ = auVar8._12_4_;
    local_bc8 = CONCAT44(local_b48._4_4_ * 1.442695,(float)local_b48 * 1.442695);
    uStack_bc0 = CONCAT44(uStack_b40._4_4_ * 1.442695,(float)uStack_b40 * 1.442695);
    fVar10 = (float)local_b48 * 1.442695 + 0.5;
    fVar12 = local_b48._4_4_ * 1.442695 + 0.5;
    fVar13 = (float)uStack_b40 * 1.442695 + 0.5;
    fVar15 = uStack_b40._4_4_ * 1.442695 + 0.5;
    local_918 = CONCAT44(fVar12,fVar10);
    uStack_910 = CONCAT44(fVar15,fVar13);
    local_8f8 = CONCAT44((int)fVar12,(int)fVar10);
    uStack_8f0 = CONCAT44((int)fVar15,(int)fVar13);
    local_c28 = (float)(int)fVar10;
    fStack_c24 = (float)(int)fVar12;
    fStack_c20 = (float)(int)fVar13;
    fStack_c1c = (float)(int)fVar15;
    local_c18 = CONCAT44(fStack_c24,local_c28);
    uStack_c10 = CONCAT44(fStack_c1c,fStack_c20);
    local_8d8 = local_c18;
    uStack_8d0 = uStack_c10;
    local_8e8 = CONCAT44(fVar12,fVar10);
    uStack_8e0 = CONCAT44(fVar15,fVar13);
    local_c58 = CONCAT44(-(uint)(fVar12 < fStack_c24),-(uint)(fVar10 < local_c28));
    uStack_c50 = CONCAT44(-(uint)(fVar15 < fStack_c1c),-(uint)(fVar13 < fStack_c20));
    local_858 = local_c58;
    uStack_850 = uStack_c50;
    local_868 = 0x3f8000003f800000;
    uStack_860 = 0x3f8000003f800000;
    local_c58 = local_c58 & 0x3f8000003f800000;
    uStack_c50 = uStack_c50 & 0x3f8000003f800000;
    local_ba8 = local_c18;
    uStack_ba0 = uStack_c10;
    local_bb8._0_4_ = (float)local_c58;
    local_bb8._4_4_ = (float)(local_c58 >> 0x20);
    uStack_bb0._0_4_ = (float)uStack_c50;
    uStack_bb0._4_4_ = (float)(uStack_c50 >> 0x20);
    local_c28 = local_c28 - (float)local_bb8;
    fStack_c24 = fStack_c24 - local_bb8._4_4_;
    fStack_c20 = fStack_c20 - (float)uStack_bb0;
    fStack_c1c = fStack_c1c - uStack_bb0._4_4_;
    local_7d0 = &local_c28;
    local_778 = ::_ps_cephes_exp_C1;
    local_7e0 = &local_c08;
    local_758 = local_c08;
    uStack_750 = uStack_c00;
    local_738 = CONCAT44(fStack_c24,local_c28);
    uStack_730 = CONCAT44(fStack_c1c,fStack_c20);
    local_748[0] = 0.6933594;
    local_748[1] = 0.6933594;
    afStack_740[0] = 0.6933594;
    afStack_740[1] = 0.6933594;
    local_768 = local_c28 * 0.6933594;
    fStack_764 = fStack_c24 * 0.6933594;
    fStack_760 = fStack_c20 * 0.6933594;
    fStack_75c = fStack_c1c * 0.6933594;
    local_c08 = CONCAT44(local_b48._4_4_ - fStack_764,(float)local_b48 - local_768);
    uStack_c00._0_4_ = (float)uStack_b40 - fStack_760;
    uStack_c00._4_4_ = uStack_b40._4_4_ - fStack_75c;
    local_7d8 = ::_ps_cephes_exp_C2;
    local_7b8 = local_c08;
    uStack_7b0 = uStack_c00;
    local_798 = CONCAT44(fStack_c24,local_c28);
    uStack_790 = CONCAT44(fStack_c1c,fStack_c20);
    local_7a8[0] = -0.00021219444;
    local_7a8[1] = -0.00021219444;
    afStack_7a0[0] = -0.00021219444;
    afStack_7a0[1] = -0.00021219444;
    local_7c8 = local_c28 * -0.00021219444;
    fStack_7c4 = fStack_c24 * -0.00021219444;
    fStack_7c0 = fStack_c20 * -0.00021219444;
    fStack_7bc = fStack_c1c * -0.00021219444;
    fVar10 = ((float)local_b48 - local_768) - local_7c8;
    fVar12 = (local_b48._4_4_ - fStack_764) - fStack_7c4;
    fVar13 = ((float)uStack_b40 - fStack_760) - fStack_7c0;
    fVar15 = (uStack_b40._4_4_ - fStack_75c) - fStack_7bc;
    local_c08 = CONCAT44(fVar12,fVar10);
    uStack_c00._0_4_ = fVar13;
    uStack_c00._4_4_ = fVar15;
    local_b78 = local_c08;
    uStack_b70 = uStack_c00;
    local_c18 = CONCAT44(fVar12 * fVar12,fVar10 * fVar10);
    uStack_c10 = CONCAT44(fVar15 * fVar15,fVar13 * fVar13);
    local_350 = &local_c68;
    local_180 = ::_ps_cephes_exp_p1;
    local_138 = 0x3950696739506967;
    uStack_130 = 0x3950696739506967;
    local_148 = local_c08;
    uStack_140 = uStack_c00;
    local_158 = fVar10 * 0.00019875691;
    fStack_154 = fVar12 * 0.00019875691;
    fStack_150 = fVar13 * 0.00019875691;
    fStack_14c = fVar15 * 0.00019875691;
    local_168[0] = 0.0013981999;
    local_168[1] = 0.0013981999;
    afStack_160[0] = 0.0013981999;
    afStack_160[1] = 0.0013981999;
    local_c68 = CONCAT44(fStack_154 + 0.0013981999,local_158 + 0.0013981999);
    uStack_c60 = CONCAT44(fStack_14c + 0.0013981999,fStack_150 + 0.0013981999);
    local_1e0 = ::_ps_cephes_exp_p2;
    local_198 = local_c68;
    uStack_190 = uStack_c60;
    local_1a8 = local_c08;
    uStack_1a0 = uStack_c00;
    local_1b8 = (local_158 + 0.0013981999) * fVar10;
    fStack_1b4 = (fStack_154 + 0.0013981999) * fVar12;
    fStack_1b0 = (fStack_150 + 0.0013981999) * fVar13;
    fStack_1ac = (fStack_14c + 0.0013981999) * fVar15;
    local_1c8[0] = 0.008333452;
    local_1c8[1] = 0.008333452;
    afStack_1c0[0] = 0.008333452;
    afStack_1c0[1] = 0.008333452;
    local_c68 = CONCAT44(fStack_1b4 + 0.008333452,local_1b8 + 0.008333452);
    uStack_c60 = CONCAT44(fStack_1ac + 0.008333452,fStack_1b0 + 0.008333452);
    local_240 = ::_ps_cephes_exp_p3;
    local_1f8 = local_c68;
    uStack_1f0 = uStack_c60;
    local_208 = local_c08;
    uStack_200 = uStack_c00;
    local_218 = (local_1b8 + 0.008333452) * fVar10;
    fStack_214 = (fStack_1b4 + 0.008333452) * fVar12;
    fStack_210 = (fStack_1b0 + 0.008333452) * fVar13;
    fStack_20c = (fStack_1ac + 0.008333452) * fVar15;
    local_228[0] = 0.041665796;
    local_228[1] = 0.041665796;
    afStack_220[0] = 0.041665796;
    afStack_220[1] = 0.041665796;
    local_c68 = CONCAT44(fStack_214 + 0.041665796,local_218 + 0.041665796);
    uStack_c60 = CONCAT44(fStack_20c + 0.041665796,fStack_210 + 0.041665796);
    local_2a0 = ::_ps_cephes_exp_p4;
    local_258 = local_c68;
    uStack_250 = uStack_c60;
    local_268 = local_c08;
    uStack_260 = uStack_c00;
    local_278 = (local_218 + 0.041665796) * fVar10;
    fStack_274 = (fStack_214 + 0.041665796) * fVar12;
    fStack_270 = (fStack_210 + 0.041665796) * fVar13;
    fStack_26c = (fStack_20c + 0.041665796) * fVar15;
    local_288[0] = 0.16666666;
    local_288[1] = 0.16666666;
    afStack_280[0] = 0.16666666;
    afStack_280[1] = 0.16666666;
    local_c68 = CONCAT44(fStack_274 + 0.16666666,local_278 + 0.16666666);
    uStack_c60 = CONCAT44(fStack_26c + 0.16666666,fStack_270 + 0.16666666);
    local_300 = ::_ps_cephes_exp_p5;
    local_2b8 = local_c68;
    uStack_2b0 = uStack_c60;
    local_2c8 = local_c08;
    uStack_2c0 = uStack_c00;
    local_2d8 = (local_278 + 0.16666666) * fVar10;
    fStack_2d4 = (fStack_274 + 0.16666666) * fVar12;
    fStack_2d0 = (fStack_270 + 0.16666666) * fVar13;
    fStack_2cc = (fStack_26c + 0.16666666) * fVar15;
    local_2e8[0] = 0.5;
    local_2e8[1] = 0.5;
    afStack_2e0[0] = 0.5;
    afStack_2e0[1] = 0.5;
    local_c68 = CONCAT44(fStack_2d4 + 0.5,local_2d8 + 0.5);
    uStack_c60 = CONCAT44(fStack_2cc + 0.5,fStack_2d0 + 0.5);
    local_358 = &local_c18;
    local_318 = local_c68;
    uStack_310 = uStack_c60;
    local_328 = local_c18;
    uStack_320 = uStack_c10;
    local_338 = (local_2d8 + 0.5) * fVar10 * fVar10;
    fStack_334 = (fStack_2d4 + 0.5) * fVar12 * fVar12;
    fStack_330 = (fStack_2d0 + 0.5) * fVar13 * fVar13;
    fStack_32c = (fStack_2cc + 0.5) * fVar15 * fVar15;
    local_348 = local_c08;
    uStack_340 = uStack_c00;
    local_c68 = CONCAT44(fStack_334 + fVar12,local_338 + fVar10);
    uStack_c60 = CONCAT44(fStack_32c + fVar15,fStack_330 + fVar13);
    local_be8 = local_c68;
    uStack_be0 = uStack_c60;
    local_bf8 = 0x3f8000003f800000;
    uStack_bf0 = 0x3f8000003f800000;
    fVar10 = local_338 + fVar10 + 1.0;
    fVar12 = fStack_334 + fVar12 + 1.0;
    fVar13 = fStack_330 + fVar13 + 1.0;
    fVar15 = fStack_32c + fVar15 + 1.0;
    local_c68 = CONCAT44(fVar12,fVar10);
    uStack_c60 = CONCAT44(fVar15,fVar13);
    local_928 = CONCAT44(fStack_c24,local_c28);
    uStack_920 = CONCAT44(fStack_c1c,fStack_c20);
    local_118 = CONCAT44((int)fStack_c24,(int)local_c28);
    uStack_110 = CONCAT44((int)fStack_c1c,(int)fStack_c20);
    iVar7 = (int)local_c28 + 0x7f;
    fStack_c34 = (float)((int)fStack_c24 + 0x7f);
    fStack_c30 = (float)((int)fStack_c20 + 0x7f);
    fStack_c2c = (float)((int)fStack_c1c + 0x7f);
    local_f8 = CONCAT44(fStack_c34,iVar7);
    uStack_f0 = CONCAT44(fStack_c2c,fStack_c30);
    local_fc = 0x17;
    local_c38 = (float)(iVar7 * 0x800000);
    local_c78 = CONCAT44(fStack_c34,local_c38);
    uStack_c70 = CONCAT44(fStack_c2c,fStack_c30);
    local_b88 = local_c68;
    uStack_b80 = uStack_c60;
    local_c68 = CONCAT44(fVar12 * fStack_c34,fVar10 * local_c38);
    uStack_c60 = CONCAT44(fVar15 * fStack_c2c,fVar13 * fStack_c30);
    local_cf0 = local_d30;
    local_d08 = local_c68;
    uStack_d00 = uStack_c60;
    *(undefined8 *)local_d30 = local_c68;
    *(undefined8 *)(local_d30 + 2) = uStack_c60;
    local_d20 = local_d20 + 1;
    local_d28 = local_d28 + 4;
    local_d30 = local_d30 + 4;
    local_cb8 = local_d68;
    uStack_cb0 = uStack_d60;
    local_ca8 = local_d58;
    uStack_ca0 = uStack_d50;
    local_c98 = local_a78;
    uStack_c90 = uStack_a70;
    local_c88 = local_d68;
    uStack_c80 = uStack_d60;
    local_bb8 = local_c58;
    uStack_bb0 = uStack_c50;
    local_b98 = local_c78;
    uStack_b90 = uStack_c70;
    local_b68 = local_b78;
    uStack_b60 = uStack_b70;
    local_b48 = uVar3;
    uStack_b40 = uVar4;
    local_a98 = local_c48;
    uStack_a90 = uStack_c40;
    local_a48 = local_ad8;
    uStack_a40 = uStack_ad0;
    local_a08 = uVar11;
    uStack_a00 = uVar14;
    local_978 = local_988;
    uStack_970 = uStack_980;
    local_958 = local_d58;
    uStack_950 = uStack_d50;
    local_898 = local_9d8;
    uStack_890 = uStack_9d0;
    local_780 = local_7e0;
    local_770 = local_7d0;
    local_6c0 = local_840;
    local_6b0 = local_710;
    local_658 = local_720;
    local_650 = local_840;
    local_5f8 = local_720;
    local_5f0 = local_840;
    local_598 = local_720;
    local_590 = local_840;
    local_538 = local_720;
    local_530 = local_840;
    local_4d8 = local_720;
    local_4d0 = local_840;
    local_478 = local_720;
    local_470 = local_840;
    local_418 = local_720;
    local_410 = local_840;
    local_3b8 = local_720;
    local_3b0 = local_840;
    local_360 = local_7e0;
    local_2f8 = local_7e0;
    local_2f0 = local_350;
    local_298 = local_7e0;
    local_290 = local_350;
    local_238 = local_7e0;
    local_230 = local_350;
    local_1d8 = local_7e0;
    local_1d0 = local_350;
    local_178 = local_7e0;
    local_170 = local_350;
    local_e8 = local_c78;
    uStack_e0 = uStack_c70;
    local_c8 = local_d58;
    uStack_c0 = uStack_d50;
    local_a8 = uVar1;
    uStack_a0 = uVar2;
    local_68 = local_bd8;
    uStack_60 = uStack_bd0;
    local_48 = local_128;
    uStack_40 = uStack_120;
    local_18 = local_9d8;
    uStack_10 = uStack_9d0;
  }
  for (; local_d3c < local_d34; local_d3c = local_d3c + 1) {
    local_cc0 = &local_d35;
    local_cc8 = local_d20;
    local_cd0 = local_d28;
    fVar10 = powf(*(float *)*local_d20,*local_d28);
    *local_d30 = fVar10;
    local_d20 = (undefined1 (*) [16])(*local_d20 + 4);
    local_d28 = local_d28 + 1;
    local_d30 = local_d30 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}